

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

char * ly_out_filepath(ly_out *out,char *filepath)

{
  FILE *__stream;
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  FILE *f;
  char *filepath_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_filepath");
    out_local = (ly_out *)0xffffffffffffffff;
    if (filepath != (char *)0x0) {
      out_local = (ly_out *)0x0;
    }
  }
  else if (out->type == LY_OUT_FILEPATH) {
    if (filepath == (char *)0x0) {
      out_local = (ly_out *)(out->method).fpath.filepath;
    }
    else {
      __stream = (FILE *)(out->method).f;
      pFVar1 = fopen(filepath,"wb");
      (out->method).f = (FILE *)pFVar1;
      if ((out->method).f == (FILE *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Failed to open file \"%s\" (%s).",filepath,pcVar3);
        (out->method).f = (FILE *)__stream;
        out_local = (ly_out *)0xffffffffffffffff;
      }
      else {
        fclose(__stream);
        free((out->method).clb.arg);
        pcVar3 = strdup(filepath);
        (out->method).fpath.filepath = pcVar3;
        out_local = (ly_out *)0x0;
      }
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "out->type == LY_OUT_FILEPATH","ly_out_filepath");
    out_local = (ly_out *)0xffffffffffffffff;
    if (filepath != (char *)0x0) {
      out_local = (ly_out *)0x0;
    }
  }
  return (char *)out_local;
}

Assistant:

LIBYANG_API_DEF const char *
ly_out_filepath(struct ly_out *out, const char *filepath)
{
    FILE *f;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_FILEPATH, filepath ? NULL : ((void *)-1));

    if (!filepath) {
        return out->method.fpath.filepath;
    }

    /* replace filepath */
    f = out->method.fpath.f;
    out->method.fpath.f = fopen(filepath, "wb");
    if (!out->method.fpath.f) {
        LOGERR(NULL, LY_ESYS, "Failed to open file \"%s\" (%s).", filepath, strerror(errno));
        out->method.fpath.f = f;
        return (void *)-1;
    }
    fclose(f);
    free(out->method.fpath.filepath);
    out->method.fpath.filepath = strdup(filepath);

    return NULL;
}